

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int AnalyzeHokuyoMessage(char *buf,int buflen)

{
  int iVar1;
  long lVar2;
  char Sum;
  undefined4 local_1c;
  
  local_1c = 0;
  Sum = '\0';
  if (((0x1c < buflen) && (*buf == 'M')) && (buf[1] == 'D')) {
    iVar1 = __isoc99_sscanf(buf,"MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n",&local_1c,&local_1c,
                            &local_1c,&local_1c,&local_1c,&local_1c,&Sum);
    if (iVar1 == 7) {
      lVar2 = 0;
      do {
        if ((buf[lVar2 + 0x19] == '\n') && (buf[lVar2 + 0x1a] == '\n')) {
          return 0;
        }
        lVar2 = lVar2 + 1;
      } while ((ulong)(buflen - 1) - 0x19 != lVar2);
    }
  }
  return 1;
}

Assistant:

inline int AnalyzeHokuyoMessage(char* buf, int buflen)
{
	int i = 0;
	char Sum = 0;

	// Check number of bytes.
	if (buflen < MIN_STANDARD_BUF_LEN_HOKUYO)
	{
		//printf("Invalid number of bytes.\n");
		return EXIT_FAILURE;
	}
	// Check first command character.
	if (buf[0] != 'M')
	{
		return EXIT_FAILURE;
	}
	// Check second command character.
	if (buf[1] != 'D')
	{
		return EXIT_FAILURE;
	}
	// Check the 26 first bytes.
	if (sscanf(buf, "MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n", &i, &i, &i, &i, &i, &i, &Sum) != 7)
	{
		return EXIT_FAILURE;
	}
	// Find the termination code ("\n\n").
	i = 25;
	for (;;)
	{
		if ((buf[i] == '\n')&&(buf[i+1] == '\n')) break;
		i++;
		if (i >= buflen-1) return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}